

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::ParallelDelaunay3d::set_vertices(ParallelDelaunay3d *this,index_t nb_vertices,double *vertices)

{
  index_t iVar1;
  signed_index_t sVar2;
  byte bVar3;
  index_t iVar4;
  uint uVar5;
  Stopwatch *pSVar6;
  double dVar7;
  double *pdVar8;
  ostream *poVar9;
  void *pvVar10;
  Delaunay3dThread *pDVar11;
  uint *puVar12;
  reference pvVar13;
  size_type sVar14;
  ulong uVar15;
  Memory *pMVar16;
  EVP_PKEY_CTX *pEVar17;
  index_t *piVar18;
  int *piVar19;
  int *piVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  index_t local_4dc;
  index_t local_404;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [36];
  uint local_33c;
  uint local_338;
  signed_index_t t_6;
  index_t i_4;
  index_t lv;
  index_t lf;
  index_t infinite_ptr;
  index_t finite_ptr;
  signed_index_t t_5;
  index_t i_3;
  index_t t_4;
  index_t nb_tets_to_delete;
  index_t nb_tets;
  vector<unsigned_int> *old2new;
  string local_300 [32];
  uint local_2e0;
  allocator local_2d9;
  index_t i_2;
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  Delaunay3dThread *local_240;
  Delaunay3dThread *tn;
  Delaunay3dThread *t0;
  Delaunay3dThread *t2;
  Delaunay3dThread *t1;
  uint local_218;
  index_t t_3;
  index_t nb_sequential_points;
  allocator local_1e9;
  string local_1e8 [32];
  int local_1c8;
  int local_1c4;
  int local_1c0;
  allocator local_1b9;
  string local_1b8 [32];
  Delaunay3dThread *local_198;
  Delaunay3dThread *thread_1;
  uint local_188;
  index_t t_2;
  index_t tot_failed_locate;
  index_t tot_rollbacks;
  Delaunay3dThread *thread;
  uint local_170;
  index_t e;
  index_t t_1;
  index_t b;
  index_t work_size;
  index_t lvl_e;
  index_t lvl_b;
  index_t local_134;
  Delaunay3dThread *pDStack_130;
  index_t first_lvl;
  Delaunay3dThread *thread0;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [36];
  uint local_d4;
  index_t lvl;
  index_t local_c8;
  uint local_c4;
  index_t pool_end;
  index_t t;
  index_t pool_begin;
  index_t pool_size;
  index_t nb_threads;
  double local_90;
  double sorting_time;
  index_t i_1;
  value_type_conflict1 local_7c [3];
  double dStack_70;
  index_t expected_tetra;
  double w;
  undefined1 local_5d;
  index_t i;
  allocator local_49;
  string local_48 [32];
  Stopwatch *local_28;
  Stopwatch *W;
  double *vertices_local;
  ParallelDelaunay3d *pPStack_10;
  index_t nb_vertices_local;
  ParallelDelaunay3d *this_local;
  
  local_28 = (Stopwatch *)0x0;
  W = (Stopwatch *)vertices;
  vertices_local._4_4_ = nb_vertices;
  pPStack_10 = this;
  if ((this->benchmark_mode_ & 1U) != 0) {
    pSVar6 = (Stopwatch *)operator_new(0x50);
    local_5d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"DelInternal",&local_49);
    Stopwatch::Stopwatch(pSVar6,(string *)local_48,true);
    local_5d = 0;
    local_28 = pSVar6;
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  if ((this->weighted_ & 1U) != 0) {
    std::vector<double,_GEO::Memory::aligned_allocator<double,_64>_>::resize
              (&(this->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>,
               (ulong)vertices_local._4_4_);
    for (w._4_4_ = 0; w._4_4_ < vertices_local._4_4_; w._4_4_ = w._4_4_ + 1) {
      dStack_70 = geo_sqr<double>(*(double *)(&W->task_name_ + (ulong)(w._4_4_ * 4 + 3) * 8));
      dStack_70 = -dStack_70;
      dVar7 = -dStack_70;
      dVar22 = geo_sqr<double>(*(double *)(&W->task_name_ + (ulong)(w._4_4_ << 2) * 8));
      dVar23 = geo_sqr<double>(*(double *)(&W->task_name_ + (ulong)(w._4_4_ * 4 + 1) * 8));
      dVar24 = geo_sqr<double>(*(double *)(&W->task_name_ + (ulong)(w._4_4_ * 4 + 2) * 8));
      pdVar8 = vector<double>::operator[](&this->heights_,w._4_4_);
      *pdVar8 = dVar7 + dVar22 + dVar23 + dVar24;
    }
  }
  Delaunay::set_vertices(&this->super_Delaunay,vertices_local._4_4_,(double *)W);
  local_7c[2] = vertices_local._4_4_ * 7;
  local_7c[1] = 0xffffffff;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::assign
            (&(this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(vertices_local._4_4_ * 0x1c),local_7c + 1);
  local_7c[0] = -1;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::assign
            (&(this->cell_to_cell_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(uint)(local_7c[2] << 2),local_7c);
  i_1 = 0xffffffff;
  std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::assign
            (&(this->cell_next_).
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,
             (ulong)(uint)local_7c[2],&i_1);
  sorting_time._7_1_ = 0xff;
  std::vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>::assign
            (&(this->cell_thread_).
              super_vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>,
             (ulong)(uint)local_7c[2],(value_type_conflict3 *)((long)&sorting_time + 7));
  iVar4 = vertices_local._4_4_;
  if (((this->super_Delaunay).do_reorder_ & 1U) == 0) {
    std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::resize
              (&(this->reorder_).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,
               (ulong)vertices_local._4_4_);
    for (sorting_time._0_4_ = 0; iVar4 = sorting_time._0_4_,
        sorting_time._0_4_ < vertices_local._4_4_; sorting_time._0_4_ = sorting_time._0_4_ + 1) {
      puVar12 = vector<unsigned_int>::operator[](&this->reorder_,sorting_time._0_4_);
      *puVar12 = iVar4;
    }
  }
  else {
    pdVar8 = Delaunay::vertex_ptr(&this->super_Delaunay,0);
    bVar3 = Delaunay::dimension(&this->super_Delaunay);
    compute_BRIO_order(iVar4,pdVar8,&this->reorder_,3,(uint)bVar3,0x40,0.125,&this->levels_);
  }
  local_90 = 0.0;
  if ((this->benchmark_mode_ & 1U) != 0) {
    local_90 = Stopwatch::elapsed_time(local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&nb_threads,"DelInternal1",(allocator *)((long)&pool_size + 3));
    poVar9 = Logger::out((string *)&nb_threads);
    poVar9 = std::operator<<(poVar9,"BRIO sorting:");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,local_90);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&nb_threads);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pool_size + 3));
  }
  pool_begin = Process::maximum_concurrent_threads();
  t = (uint)local_7c[2] / pool_begin;
  pool_end = 0;
  std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
  clear(&this->threads_);
  for (local_c4 = 0; local_c4 < pool_begin; local_c4 = local_c4 + 1) {
    if (local_c4 == pool_begin - 1) {
      local_404 = local_7c[2];
    }
    else {
      local_404 = pool_end + t;
    }
    local_c8 = local_404;
    pDVar11 = (Delaunay3dThread *)operator_new(0x2f80);
    Delaunay3dThread::Delaunay3dThread(pDVar11,this,pool_end,local_c8);
    SmartPointer<GEO::Thread>::SmartPointer
              ((SmartPointer<GEO::Thread> *)&stack0xffffffffffffff30,(Thread *)pDVar11);
    std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
    push_back(&this->threads_,(SmartPointer<GEO::Thread> *)&stack0xffffffffffffff30);
    SmartPointer<GEO::Thread>::~SmartPointer((SmartPointer<GEO::Thread> *)&stack0xffffffffffffff30);
    pool_end = local_c8;
  }
  local_d4 = 1;
  while( true ) {
    uVar5 = local_d4;
    iVar4 = vector<unsigned_int>::size(&this->levels_);
    bVar21 = false;
    if (uVar5 < iVar4 - 1) {
      puVar12 = vector<unsigned_int>::operator[](&this->levels_,local_d4);
      bVar21 = *puVar12 < 1000;
    }
    if (!bVar21) break;
    local_d4 = local_d4 + 1;
  }
  if ((this->benchmark_mode_ & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"PDEL",&local_f9);
    poVar9 = Logger::out((string *)local_f8);
    poVar9 = std::operator<<(poVar9,"Using ");
    iVar4 = vector<unsigned_int>::size(&this->levels_);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4 - 1);
    poVar9 = std::operator<<(poVar9," levels");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"PDEL",(allocator *)((long)&thread0 + 7));
    poVar9 = Logger::out((string *)local_120);
    poVar9 = std::operator<<(poVar9,"Levels 0 - ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_d4 - 1);
    poVar9 = std::operator<<(poVar9,": bootstraping with first levels in sequential mode");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&thread0 + 7));
  }
  pvVar13 = std::
            vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
            ::operator[](&this->threads_,0);
  pDStack_130 = (Delaunay3dThread *)SmartPointer<GEO::Thread>::get(pvVar13);
  Delaunay3dThread::create_first_tetrahedron(pDStack_130);
  pDVar11 = pDStack_130;
  puVar12 = vector<unsigned_int>::operator[](&this->levels_,0);
  iVar4 = *puVar12;
  puVar12 = vector<unsigned_int>::operator[](&this->levels_,local_d4);
  Delaunay3dThread::set_work(pDVar11,iVar4,*puVar12);
  (*(pDStack_130->super_Thread).super_Counted._vptr_Counted[2])();
  local_134 = local_d4;
  for (; uVar5 = local_d4, iVar4 = vector<unsigned_int>::size(&this->levels_), uVar5 < iVar4 - 1;
      local_d4 = local_d4 + 1) {
    if ((this->benchmark_mode_ & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&lvl_b,"PDEL",(allocator *)((long)&lvl_e + 3));
      poVar9 = Logger::out((string *)&lvl_b);
      poVar9 = std::operator<<(poVar9,"Level ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_d4);
      poVar9 = std::operator<<(poVar9," : start");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&lvl_b);
      std::allocator<char>::~allocator((allocator<char> *)((long)&lvl_e + 3));
    }
    puVar12 = vector<unsigned_int>::operator[](&this->levels_,local_d4);
    work_size = *puVar12;
    puVar12 = vector<unsigned_int>::operator[](&this->levels_,local_d4 + 1);
    b = *puVar12;
    uVar5 = b - work_size;
    sVar14 = std::
             vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
             ::size(&this->threads_);
    t_1 = (index_t)((ulong)uVar5 / (sVar14 & 0xffffffff));
    e = work_size;
    for (local_170 = 0; uVar15 = (ulong)local_170,
        sVar14 = std::
                 vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                 ::size(&this->threads_), uVar15 < sVar14; local_170 = local_170 + 1) {
      uVar15 = (ulong)local_170;
      sVar14 = std::
               vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
               ::size(&this->threads_);
      if (uVar15 == sVar14 - 1) {
        local_4dc = b;
      }
      else {
        local_4dc = e + t_1;
      }
      thread._4_4_ = local_4dc;
      pvVar13 = std::
                vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                ::operator[](&this->threads_,(ulong)local_170);
      _tot_failed_locate = (Delaunay3dThread *)SmartPointer<GEO::Thread>::get(pvVar13);
      if ((local_d4 == local_134) && (local_170 != 0)) {
        Delaunay3dThread::initialize_from(_tot_failed_locate,pDStack_130);
      }
      Delaunay3dThread::set_work(_tot_failed_locate,e,thread._4_4_);
      e = thread._4_4_;
    }
    Process::run_threads(&this->threads_);
  }
  if ((this->benchmark_mode_ & 1U) != 0) {
    t_2 = 0;
    local_188 = 0;
    for (thread_1._4_4_ = 0; uVar15 = (ulong)thread_1._4_4_,
        sVar14 = std::
                 vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                 ::size(&this->threads_), uVar15 < sVar14; thread_1._4_4_ = thread_1._4_4_ + 1) {
      pvVar13 = std::
                vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                ::operator[](&this->threads_,(ulong)thread_1._4_4_);
      local_198 = (Delaunay3dThread *)SmartPointer<GEO::Thread>::get(pvVar13);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"PDEL",&local_1b9);
      poVar9 = Logger::out((string *)local_1b8);
      poVar9 = std::operator<<(poVar9,"thread ");
      local_1c0 = (int)std::setw(3);
      poVar9 = std::operator<<(poVar9,(_Setw)local_1c0);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,thread_1._4_4_);
      poVar9 = std::operator<<(poVar9," : ");
      local_1c4 = (int)std::setw(3);
      poVar9 = std::operator<<(poVar9,(_Setw)local_1c4);
      iVar4 = Delaunay3dThread::nb_rollbacks(local_198);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
      poVar9 = std::operator<<(poVar9," rollbacks  ");
      local_1c8 = (int)std::setw(3);
      poVar9 = std::operator<<(poVar9,(_Setw)local_1c8);
      iVar4 = Delaunay3dThread::nb_failed_locate(local_198);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
      poVar9 = std::operator<<(poVar9," restarted locate");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      iVar4 = Delaunay3dThread::nb_rollbacks(local_198);
      t_2 = iVar4 + t_2;
      iVar4 = Delaunay3dThread::nb_failed_locate(local_198);
      local_188 = iVar4 + local_188;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"PDEL",&local_1e9);
    poVar9 = Logger::out((string *)local_1e8);
    poVar9 = std::operator<<(poVar9,"------------------");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&nb_sequential_points,"PDEL",(allocator *)((long)&t_3 + 3));
    poVar9 = Logger::out((string *)&nb_sequential_points);
    poVar9 = std::operator<<(poVar9,"total: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,t_2);
    poVar9 = std::operator<<(poVar9," rollbacks  ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_188);
    poVar9 = std::operator<<(poVar9," restarted locate");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&nb_sequential_points);
    std::allocator<char>::~allocator((allocator<char> *)((long)&t_3 + 3));
  }
  local_218 = 0;
  for (t1._4_4_ = 0; uVar15 = (ulong)t1._4_4_,
      sVar14 = std::
               vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
               ::size(&this->threads_), uVar15 < sVar14; t1._4_4_ = t1._4_4_ + 1) {
    pvVar13 = std::
              vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
              ::operator[](&this->threads_,(ulong)t1._4_4_);
    t2 = (Delaunay3dThread *)SmartPointer<GEO::Thread>::get(pvVar13);
    iVar4 = Delaunay3dThread::work_size(t2);
    local_218 = iVar4 + local_218;
    if (t1._4_4_ != 0) {
      pvVar13 = std::
                vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                ::operator[](&this->threads_,(ulong)(t1._4_4_ - 1));
      t0 = (Delaunay3dThread *)SmartPointer<GEO::Thread>::get(pvVar13);
      Delaunay3dThread::initialize_from(t2,t0);
    }
    (*(t2->super_Thread).super_Counted._vptr_Counted[2])();
  }
  if (local_218 != 0) {
    pvVar13 = std::
              vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
              ::operator[](&this->threads_,0);
    tn = (Delaunay3dThread *)SmartPointer<GEO::Thread>::get(pvVar13);
    sVar14 = std::
             vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
             ::size(&this->threads_);
    pvVar13 = std::
              vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
              ::operator[](&this->threads_,sVar14 - 1);
    local_240 = (Delaunay3dThread *)SmartPointer<GEO::Thread>::get(pvVar13);
    Delaunay3dThread::initialize_from(tn,local_240);
  }
  if ((this->benchmark_mode_ & 1U) != 0) {
    if (local_218 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"PDEL",&local_2b1);
      poVar9 = Logger::out((string *)local_2b0);
      poVar9 = std::operator<<(poVar9,"All the points were inserted in parallel mode");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,"PDEL",&local_261);
      poVar9 = Logger::out((string *)local_260);
      poVar9 = std::operator<<(poVar9,"Local thread memory overflow occurred:");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"PDEL",&local_289);
      poVar9 = Logger::out((string *)local_288);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_218);
      poVar9 = std::operator<<(poVar9," points inserted in sequential mode");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
    }
  }
  if ((this->benchmark_mode_ & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_2,"DelInternal2",&local_2d9);
    poVar9 = Logger::out((string *)&i_2);
    poVar9 = std::operator<<(poVar9,"Core insertion algo:");
    dVar7 = Stopwatch::elapsed_time(local_28);
    pvVar10 = (void *)std::ostream::operator<<(poVar9,dVar7 - local_90);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&i_2);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  }
  pSVar6 = local_28;
  if (local_28 != (Stopwatch *)0x0) {
    Stopwatch::~Stopwatch(local_28);
    operator_delete(pSVar6);
  }
  if ((this->debug_mode_ & 1U) != 0) {
    for (local_2e0 = 0; uVar15 = (ulong)local_2e0,
        sVar14 = std::
                 vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                 ::size(&this->threads_), uVar15 < sVar14; local_2e0 = local_2e0 + 1) {
      poVar9 = (ostream *)std::ostream::operator<<(&std::cerr,local_2e0);
      poVar9 = std::operator<<(poVar9," : ");
      pvVar13 = std::
                vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                ::operator[](&this->threads_,(ulong)local_2e0);
      pDVar11 = (Delaunay3dThread *)SmartPointer<GEO::Thread>::get(pvVar13);
      iVar4 = Delaunay3dThread::max_t(pDVar11);
      pvVar10 = (void *)std::ostream::operator<<(poVar9,iVar4);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
    Delaunay3dThread::check_combinatorics(pDStack_130,(bool)(this->verbose_debug_mode_ & 1));
    Delaunay3dThread::check_geometry(pDStack_130,(bool)(this->verbose_debug_mode_ & 1));
  }
  if ((this->benchmark_mode_ & 1U) != 0) {
    pSVar6 = (Stopwatch *)operator_new(0x50);
    old2new._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"DelCompress",(allocator *)((long)&old2new + 7));
    Stopwatch::Stopwatch(pSVar6,(string *)local_300,true);
    old2new._6_1_ = 0;
    local_28 = pSVar6;
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator((allocator<char> *)((long)&old2new + 7));
  }
  _nb_tets_to_delete = &this->cell_next_;
  t_4 = 0;
  i_3 = 0;
  for (t_5 = 0; sVar2 = t_5, iVar4 = Delaunay3dThread::max_t(pDStack_130), (uint)sVar2 < iVar4;
      t_5 = t_5 + 1) {
    if (((((this->super_Delaunay).keep_infinite_ & 1U) != 0) &&
        (bVar21 = Delaunay3dThread::tet_is_free(pDStack_130,t_5), !bVar21)) ||
       (bVar21 = Delaunay3dThread::tet_is_real(pDStack_130,t_5), bVar21)) {
      if (t_5 != t_4) {
        pMVar16 = (Memory *)vector<int>::operator[](&this->cell_to_v_store_,t_4 << 2);
        pEVar17 = (EVP_PKEY_CTX *)vector<int>::operator[](&this->cell_to_v_store_,t_5 << 2);
        Memory::copy(pMVar16,pEVar17,(EVP_PKEY_CTX *)0x10);
        pMVar16 = (Memory *)vector<int>::operator[](&this->cell_to_cell_store_,t_4 << 2);
        pEVar17 = (EVP_PKEY_CTX *)vector<int>::operator[](&this->cell_to_cell_store_,t_5 << 2);
        Memory::copy(pMVar16,pEVar17,(EVP_PKEY_CTX *)0x10);
      }
      iVar4 = t_4;
      puVar12 = vector<unsigned_int>::operator[](_nb_tets_to_delete,t_5);
      *puVar12 = iVar4;
      t_4 = t_4 + 1;
    }
    else {
      puVar12 = vector<unsigned_int>::operator[](_nb_tets_to_delete,t_5);
      *puVar12 = 0xffffffff;
      i_3 = i_3 + 1;
    }
  }
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
            (&(this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(t_4 << 2));
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
            (&(this->cell_to_cell_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,(ulong)(t_4 << 2));
  for (finite_ptr = 0; finite_ptr < t_4 << 2; finite_ptr = finite_ptr + 1) {
    piVar18 = (index_t *)vector<int>::operator[](&this->cell_to_cell_store_,finite_ptr);
    infinite_ptr = *piVar18;
    puVar12 = vector<unsigned_int>::operator[](_nb_tets_to_delete,infinite_ptr);
    uVar5 = *puVar12;
    infinite_ptr = uVar5;
    puVar12 = (uint *)vector<int>::operator[](&this->cell_to_cell_store_,finite_ptr);
    *puVar12 = uVar5;
  }
  if (((this->super_Delaunay).keep_infinite_ & 1U) != 0) {
    (this->super_Delaunay).nb_finite_cells_ = 0;
    lf = 0;
    lv = t_4;
    while( true ) {
      lv = lv - 1;
      while (bVar21 = Delaunay3dThread::tet_is_finite(pDStack_130,lf), iVar4 = lf, bVar21) {
        puVar12 = vector<unsigned_int>::operator[](_nb_tets_to_delete,lf);
        *puVar12 = iVar4;
        lf = lf + 1;
        (this->super_Delaunay).nb_finite_cells_ = (this->super_Delaunay).nb_finite_cells_ + 1;
      }
      while (bVar21 = Delaunay3dThread::tet_is_finite(pDStack_130,lv), iVar4 = lv,
            ((bVar21 ^ 0xffU) & 1) != 0) {
        puVar12 = vector<unsigned_int>::operator[](_nb_tets_to_delete,lv);
        *puVar12 = iVar4;
        lv = lv - 1;
      }
      if (lv < lf) break;
      puVar12 = vector<unsigned_int>::operator[](_nb_tets_to_delete,lf);
      iVar1 = lf;
      *puVar12 = iVar4;
      puVar12 = vector<unsigned_int>::operator[](_nb_tets_to_delete,lv);
      *puVar12 = iVar1;
      (this->super_Delaunay).nb_finite_cells_ = (this->super_Delaunay).nb_finite_cells_ + 1;
      for (i_4 = 0; i_4 < 4; i_4 = i_4 + 1) {
        piVar19 = vector<int>::operator[](&this->cell_to_cell_store_,lf * 4 + i_4);
        piVar20 = vector<int>::operator[](&this->cell_to_cell_store_,lv * 4 + i_4);
        std::swap<int>(piVar19,piVar20);
      }
      for (t_6 = 0; (uint)t_6 < 4; t_6 = t_6 + 1) {
        piVar19 = vector<int>::operator[](&this->cell_to_v_store_,lf * 4 + t_6);
        piVar20 = vector<int>::operator[](&this->cell_to_v_store_,lv * 4 + t_6);
        std::swap<int>(piVar19,piVar20);
      }
      lf = lf + 1;
    }
    for (local_338 = 0; local_338 < t_4 << 2; local_338 = local_338 + 1) {
      piVar19 = vector<int>::operator[](&this->cell_to_cell_store_,local_338);
      local_33c = *piVar19;
      puVar12 = vector<unsigned_int>::operator[](_nb_tets_to_delete,local_33c);
      uVar5 = *puVar12;
      local_33c = uVar5;
      puVar12 = (uint *)vector<int>::operator[](&this->cell_to_cell_store_,local_338);
      *puVar12 = uVar5;
    }
  }
  if ((this->benchmark_mode_ & 1U) != 0) {
    if (((this->super_Delaunay).keep_infinite_ & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_388,"DelCompress",&local_389);
      poVar9 = Logger::out((string *)local_388);
      poVar9 = std::operator<<(poVar9,"Removed ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,i_3);
      poVar9 = std::operator<<(poVar9," tets (free list and infinite)");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator((allocator<char> *)&local_389);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_360,"DelCompress",&local_361);
      poVar9 = Logger::out((string *)local_360);
      poVar9 = std::operator<<(poVar9,"Removed ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,i_3);
      poVar9 = std::operator<<(poVar9," tets (free list)");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
    }
  }
  pSVar6 = local_28;
  if (local_28 != (Stopwatch *)0x0) {
    Stopwatch::~Stopwatch(local_28);
    operator_delete(pSVar6);
  }
  iVar4 = t_4;
  piVar19 = vector<int>::data(&this->cell_to_v_store_);
  piVar20 = vector<int>::data(&this->cell_to_cell_store_);
  (*(this->super_Delaunay).super_Counted._vptr_Counted[9])(this,(ulong)iVar4,piVar19,piVar20);
  return;
}

Assistant:

void ParallelDelaunay3d::set_vertices(
        index_t nb_vertices, const double* vertices
    ) {
        Stopwatch* W = nullptr ;
        if(benchmark_mode_) {
            W = new Stopwatch("DelInternal");
        }

        if(weighted_) {
            heights_.resize(nb_vertices);
            for(index_t i = 0; i < nb_vertices; ++i) {
                // Client code uses 4d embedding with ti = sqrt(W - wi)
                //   where W = max(wi)
                // We recompute the standard "shifted" lifting on
                // the paraboloid from it.
                // (we use wi - W, everything is shifted by W, but
                // we do not care since the power diagram is invariant
                // by a translation of all weights).
                double w = -geo_sqr(vertices[4 * i + 3]);
                heights_[i] = -w +
                    geo_sqr(vertices[4 * i]) +
                    geo_sqr(vertices[4 * i + 1]) +
                    geo_sqr(vertices[4 * i + 2]);
            }
        }
        Delaunay::set_vertices(nb_vertices, vertices);

        index_t expected_tetra = nb_vertices * 7;
    
        // Allocate the tetrahedra
        cell_to_v_store_.assign(expected_tetra * 4,-1);
        cell_to_cell_store_.assign(expected_tetra * 4,-1);
        cell_next_.assign(expected_tetra,index_t(-1));
        cell_thread_.assign(expected_tetra,thread_index_t(-1));

        // Reorder the points
        if(do_reorder_) {
            compute_BRIO_order(
                nb_vertices, vertex_ptr(0), reorder_,
		3, dimension(),
                64, 0.125,
                &levels_
            );        
        } else {
            reorder_.resize(nb_vertices);
            for(index_t i = 0; i < nb_vertices; ++i) {
                reorder_[i] = i;
            }
            geo_debug_assert(levels_[0] == 0);
            geo_debug_assert(levels_[levels_.size()-1] == nb_vertices);
        }

        double sorting_time = 0;
        if(benchmark_mode_) {
            sorting_time = W->elapsed_time();
            Logger::out("DelInternal1") << "BRIO sorting:"
                                       << sorting_time
                                       << std::endl;
        } 

        // Create the threads
        index_t nb_threads = Process::maximum_concurrent_threads();
        index_t pool_size = expected_tetra / nb_threads;
        index_t pool_begin = 0;
        threads_.clear();
        for(index_t t=0; t<nb_threads; ++t) {
            index_t pool_end = 
                (t == nb_threads - 1) ? expected_tetra : pool_begin + pool_size;
            threads_.push_back(
                new Delaunay3dThread(this, pool_begin, pool_end)
            );
            pool_begin = pool_end;
        }


        // Create first tetrahedron and triangulate first set of points 
        // in sequential mode.


        index_t lvl = 1;
        while(lvl < (levels_.size() - 1) && levels_[lvl] < 1000) {
            ++lvl;
        }

        if(benchmark_mode_) {
            Logger::out("PDEL")
                << "Using " << levels_.size()-1 << " levels" << std::endl;
            Logger::out("PDEL") 
                << "Levels 0 - " << lvl-1 
                << ": bootstraping with first levels in sequential mode"
                << std::endl;
        }
        Delaunay3dThread* thread0 = 
                    static_cast<Delaunay3dThread*>(threads_[0].get());
        thread0->create_first_tetrahedron();
        thread0->set_work(levels_[0], levels_[lvl]);
        thread0->run();

        index_t first_lvl = lvl;

        // Insert points in all BRIO levels
        for(; lvl<levels_.size()-1; ++lvl) {

            if(benchmark_mode_) {
                Logger::out("PDEL") << "Level " 
                                    << lvl << " : start" << std::endl;
            }

            index_t lvl_b = levels_[lvl];
            index_t lvl_e = levels_[lvl+1];
            index_t work_size = (lvl_e - lvl_b)/index_t(threads_.size());

            // Initialize threads
            index_t b = lvl_b;
            for(index_t t=0; t<threads_.size(); ++t) {
                index_t e = t == threads_.size()-1 ? lvl_e : b+work_size;
                Delaunay3dThread* thread = 
                    static_cast<Delaunay3dThread*>(threads_[t].get());
                
                // Copy the indices of the first created tetrahedron
                // and the maximum valid tetrahedron index max_t_
                if(lvl == first_lvl && t!=0) {
                    thread->initialize_from(thread0);
                }
                thread->set_work(b,e);
                b = e;
            }
            Process::run_threads(threads_);
        }


        if(benchmark_mode_) {
            index_t tot_rollbacks = 0 ;
            index_t tot_failed_locate = 0 ;
            for(index_t t=0; t<threads_.size(); ++t) {
                Delaunay3dThread* thread = 
                    static_cast<Delaunay3dThread*>(threads_[t].get());
                Logger::out("PDEL") 
                    << "thread " << std::setw(3) << t << " : " 
                    << std::setw(3) << thread->nb_rollbacks() << " rollbacks  "
                    << std::setw(3) << thread->nb_failed_locate() << " restarted locate"
                    << std::endl;
                tot_rollbacks += thread->nb_rollbacks();
                tot_failed_locate += thread->nb_failed_locate();
            }
            Logger::out("PDEL") << "------------------" << std::endl;
            Logger::out("PDEL") << "total: " 
                                << tot_rollbacks << " rollbacks  "
                                << tot_failed_locate << " restarted locate"
                                << std::endl;
        }

        // Run threads sequentialy, to insert missing points if
        // memory overflow was encountered (in sequential mode,
        // dynamic memory growing works)

        index_t nb_sequential_points = 0;
        for(index_t t=0; t<threads_.size(); ++t) {
            Delaunay3dThread* t1 = 
                static_cast<Delaunay3dThread*>(threads_[t].get());

            nb_sequential_points += t1->work_size();

            if(t != 0) {
                // We need to copy max_t_ from previous thread, 
                // since the memory pool may have grown.
                Delaunay3dThread* t2 = 
                    static_cast<Delaunay3dThread*>(threads_[t-1].get());
                t1->initialize_from(t2);
            }
            t1->run();
        }

        //  If some tetrahedra were created in sequential mode, then
        // the maximum valid tetrahedron index was increased by all
        // the threads in increasing number, so we copy it from the
        // last thread into thread0 since we use thread0 afterwards
        // to do the "compaction" afterwards.
        
        if(nb_sequential_points != 0) {
            Delaunay3dThread* t0 = 
                static_cast<Delaunay3dThread*>(threads_[0].get());
            Delaunay3dThread* tn = 
                static_cast<Delaunay3dThread*>(
                    threads_[threads_.size()-1].get()
                );
            t0->initialize_from(tn);
        }
        

        
        if(benchmark_mode_) {
            if(nb_sequential_points != 0) {
                Logger::out("PDEL") << "Local thread memory overflow occurred:"
                                    << std::endl;
                Logger::out("PDEL") << nb_sequential_points
                                    << " points inserted in sequential mode"
                                    << std::endl;
            } else {
                Logger::out("PDEL") 
                    << "All the points were inserted in parallel mode"
                    << std::endl;
            }
        }

        if(benchmark_mode_) {
            Logger::out("DelInternal2") << "Core insertion algo:"
                                       << W->elapsed_time() - sorting_time
                                       << std::endl;
        }
        delete W;

        if(debug_mode_) {
            for(index_t i=0; i<threads_.size(); ++i) {
                std::cerr << i << " : " <<
                    static_cast<Delaunay3dThread*>(threads_[i].get())
                    ->max_t() << std::endl;
            }
            
            thread0->check_combinatorics(verbose_debug_mode_);
            thread0->check_geometry(verbose_debug_mode_);
        }

        if(benchmark_mode_) {
            W = new Stopwatch("DelCompress");
        }

        //   Compress cell_to_v_store_ and cell_to_cell_store_
        // (remove free and virtual tetrahedra).
        //   Since cell_next_ is not used at this point,
        // we reuse it for storing the conversion array that
        // maps old tet indices to new tet indices
        // Note: tet_is_real() uses the previous value of 
        // cell_next(), but we are processing indices
        // in increasing order and since old2new[t] is always
        // smaller or equal to t, we never overwrite a value
        // before needing it.
        
        vector<index_t>& old2new = cell_next_;
        index_t nb_tets = 0;
        index_t nb_tets_to_delete = 0;

        {
            for(index_t t = 0; t < thread0->max_t(); ++t) {
                if(
                    (keep_infinite_ && !thread0->tet_is_free(t)) ||
                    thread0->tet_is_real(t)
                ) {
                    if(t != nb_tets) {
                        Memory::copy(
                            &cell_to_v_store_[nb_tets * 4],
                            &cell_to_v_store_[t * 4],
                            4 * sizeof(signed_index_t)
                        );
                        Memory::copy(
                            &cell_to_cell_store_[nb_tets * 4],
                            &cell_to_cell_store_[t * 4],
                            4 * sizeof(signed_index_t)
                        );
                    }
                    old2new[t] = nb_tets;
                    ++nb_tets;
                } else {
                    old2new[t] = index_t(-1);
                    ++nb_tets_to_delete;
                }
            }

            cell_to_v_store_.resize(4 * nb_tets);
            cell_to_cell_store_.resize(4 * nb_tets);
            for(index_t i = 0; i < 4 * nb_tets; ++i) {
                signed_index_t t = cell_to_cell_store_[i];
                geo_debug_assert(t >= 0);
                t = signed_index_t(old2new[t]);
                // Note: t can be equal to -1 when a real tet is
                // adjacent to a virtual one (and this is how the
                // rest of Vorpaline expects to see tets on the
                // border).
                geo_debug_assert(!(keep_infinite_ && t < 0));
                cell_to_cell_store_[i] = t;
            }
        }

        // In "keep_infinite" mode, we reorder the cells in such
        // a way that finite cells have indices [0..nb_finite_cells_-1]
        // and infinite cells have indices [nb_finite_cells_ .. nb_cells_-1]
        
        if(keep_infinite_) {
            nb_finite_cells_ = 0;
            index_t finite_ptr = 0;
            index_t infinite_ptr = nb_tets - 1;
            for(;;) {
                while(thread0->tet_is_finite(finite_ptr)) {
                    old2new[finite_ptr] = finite_ptr;
                    ++finite_ptr;
                    ++nb_finite_cells_;
                }
                while(!thread0->tet_is_finite(infinite_ptr)) {
                    old2new[infinite_ptr] = infinite_ptr;
                    --infinite_ptr;
                }
                if(finite_ptr > infinite_ptr) {
                    break;
                }
                old2new[finite_ptr] = infinite_ptr;
                old2new[infinite_ptr] = finite_ptr;
                ++nb_finite_cells_;
                for(index_t lf=0; lf<4; ++lf) {
                    std::swap(
                        cell_to_cell_store_[4*finite_ptr + lf],
                        cell_to_cell_store_[4*infinite_ptr + lf]
                    );
                }
                for(index_t lv=0; lv<4; ++lv) {
                    std::swap(
                        cell_to_v_store_[4*finite_ptr + lv],
                        cell_to_v_store_[4*infinite_ptr + lv]
                    );
                }
                ++finite_ptr;
                --infinite_ptr;
            }
            for(index_t i = 0; i < 4 * nb_tets; ++i) {
                signed_index_t t = cell_to_cell_store_[i];
                geo_debug_assert(t >= 0);
                t = signed_index_t(old2new[t]);
                geo_debug_assert(t >= 0);
                cell_to_cell_store_[i] = t;
            }
        }
        
        
        if(benchmark_mode_) {
            if(keep_infinite_) {
                Logger::out("DelCompress") 
                    << "Removed " << nb_tets_to_delete 
                    << " tets (free list)" << std::endl;
            } else {
                Logger::out("DelCompress") 
                    << "Removed " << nb_tets_to_delete 
                    << " tets (free list and infinite)" << std::endl;
            }
        }

        delete W;

        set_arrays(
            nb_tets,
            cell_to_v_store_.data(),
            cell_to_cell_store_.data()
        );
    }